

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Event.h
# Opt level: O2

void __thiscall entityx::BaseReceiver::~BaseReceiver(BaseReceiver *this)

{
  __node_base *p_Var1;
  pair<const_unsigned_long,_std::pair<std::weak_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_unsigned_long>_>
  connection;
  __shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>,_(__gnu_cxx::_Lock_policy)2>
  local_60;
  pair<const_unsigned_long,_std::pair<std::weak_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_unsigned_long>_>
  local_50;
  
  this->_vptr_BaseReceiver = (_func_int **)&PTR__BaseReceiver_001eab28;
  p_Var1 = &(this->connections_)._M_h._M_before_begin;
  while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
    Catch::clara::std::
    pair<const_unsigned_long,_std::pair<std::weak_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_unsigned_long>_>
    ::pair(&local_50,
           (pair<const_unsigned_long,_std::pair<std::weak_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_unsigned_long>_>
            *)(p_Var1 + 1));
    if ((local_50.second.first.
         super___weak_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
       ((local_50.second.first.
         super___weak_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi)->_M_use_count != 0)) {
      Catch::clara::std::
      __shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>,_(__gnu_cxx::_Lock_policy)2>
      ::__shared_ptr(&local_60,&local_50.second);
      Simple::Lib::ProtoSignal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>::
      disconnect(&(local_60._M_ptr)->
                  super_ProtoSignal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>,
                 local_50.second.second);
      Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_60._M_refcount);
    }
    Catch::clara::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
              (&local_50.second.first.
                super___weak_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
  }
  Catch::clara::std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::pair<std::weak_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_unsigned_long>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<std::weak_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_unsigned_long>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->connections_)._M_h);
  return;
}

Assistant:

virtual ~BaseReceiver() {
    for (auto connection : connections_) {
      auto &ptr = connection.second.first;
      if (!ptr.expired()) {
        ptr.lock()->disconnect(connection.second.second);
      }
    }
  }